

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp.c
# Opt level: O2

MPP_RET open_client(Kmpp *ctx)

{
  RK_S32 RVar1;
  MPP_RET MVar2;
  
  if (ctx != (Kmpp *)0x0) {
    RVar1 = mpp_vcodec_open();
    ctx->mClientFd = RVar1;
    MVar2 = MPP_OK;
    if (RVar1 < 0) {
      _mpp_log_l(2,"kmpp","mpp_vcodec dev open failed\n",(char *)0x0);
      MVar2 = MPP_NOK;
    }
    return MVar2;
  }
  return MPP_ERR_VALUE;
}

Assistant:

static MPP_RET open_client(Kmpp *ctx)
{
    if (!ctx)
        return MPP_ERR_VALUE;

    ctx->mClientFd = mpp_vcodec_open();
    if (ctx->mClientFd < 0) {
        mpp_err("mpp_vcodec dev open failed\n");
        return MPP_NOK;
    }
    return MPP_OK;
}